

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

address __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
          (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *v,not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  ulong uVar1;
  archive_result_type<pstore::serialize::archive::database_writer_&> aVar2;
  database_writer local_40;
  
  (**(code **)(*(long *)this + 0x10))(this,0,4);
  local_40.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
  bytes_consumed_ = 0;
  local_40.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.flushed_ =
       false;
  local_40.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.
  _vptr_writer_base = (_func_int **)&PTR__writer_base_0026b400;
  local_40.super_writer_base<pstore::serialize::archive::details::database_writer_policy>.policy_.
  transaction_ = (transaction_base *)this;
  aVar2 = serialize::string_helper::
          write<pstore::serialize::archive::database_writer&,std::__cxx11::string>
                    (&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     transaction);
  serialize::string_helper::write<pstore::serialize::archive::database_writer&,std::__cxx11::string>
            (&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &transaction->first_);
  if ((aVar2.a_ & 3) != 0) {
    assert_failed("(result.absolute () & (aligned_to - 1U)) == 0U",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x2d5);
  }
  uVar1 = v[3].first.field_2._M_allocated_capacity;
  if (uVar1 < 0xd) {
    v[3].first.field_2._M_allocated_capacity = uVar1 + 1;
    (&(v->first)._M_dataplus)[uVar1 * 2]._M_p = (pointer)aVar2.a_;
    (&(v->first)._M_string_length)[uVar1 * 2] = 0xffffffffffffffff;
    return (address)aVar2.a_;
  }
  assert_failed("elements_ < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                ,100);
}

Assistant:

address hamt_map<KeyType, ValueType, Hash, KeyEqual>::store_leaf_node (
            transaction_base & transaction, OtherValueType const & v,
            gsl::not_null<parent_stack *> const parents) {

            // Make sure the alignment of leaf node is 4 to ensure that the two LSB are guaranteed
            // 0. If 'v' has greater alignment, serialize::write() will add additional padding.
            constexpr auto aligned_to = std::size_t{4};
            static_assert ((details::internal_node_bit | details::heap_node_bit) == aligned_to - 1,
                           "expected required alignment to be 4");
            transaction.allocate (0, aligned_to);

            // Now write the node and return where it went.
            address const result =
                serialize::write (serialize::archive::make_writer (transaction), v);
            PSTORE_ASSERT ((result.absolute () & (aligned_to - 1U)) == 0U);
            parents->push (details::parent_type{index_pointer{result}});

            return result;
        }